

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O2

int __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::close
          (vertex_sequence<agg::vertex_dist,_6U> *this,int __fd)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar4;
  uint uVar5;
  vertex_dist t;
  vertex_dist local_38;
  
  while (uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size, 1 < uVar5) {
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    bVar3 = vertex_dist::operator()
                      (ppvVar1[uVar5 - 2 >> 6] + (uVar5 - 2 & 0x3f),
                       ppvVar1[uVar5 - 1 >> 6] + (uVar5 - 1 & 0x3f));
    uVar5 = (uint)CONCAT71(extraout_var,bVar3);
    if (bVar3) break;
    uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    uVar4 = uVar5 - 1 & 0x3f;
    pvVar2 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar5 - 1 >> 6];
    local_38.dist = pvVar2[uVar4].dist;
    pvVar2 = pvVar2 + uVar4;
    local_38.x = pvVar2->x;
    local_38.y = pvVar2->y;
    if (uVar5 != 0) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar5 - 1;
    }
    modify_last(this,&local_38);
  }
  if ((char)__fd != '\0') {
    uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
    while (1 < uVar5) {
      ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
      bVar3 = vertex_dist::operator()(ppvVar1[uVar5 - 1 >> 6] + (uVar5 - 1 & 0x3f),*ppvVar1);
      if (bVar3) {
        return (int)CONCAT71(extraout_var_00,bVar3);
      }
      uVar4 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
      uVar5 = 0;
      if (uVar4 != 0) {
        uVar5 = uVar4 - 1;
        (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar5;
      }
    }
  }
  return uVar5;
}

Assistant:

void vertex_sequence<T, S>::close(bool closed)
    {
        while(base_type::size() > 1)
        {
            if((*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) break;
            T t = (*this)[base_type::size() - 1];
            base_type::remove_last();
            modify_last(t);
        }

        if(closed)
        {
            while(base_type::size() > 1)
            {
                if((*this)[base_type::size() - 1]((*this)[0])) break;
                base_type::remove_last();
            }
        }
    }